

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

bool __thiscall Lexer::isWord(Lexer *this,string *token,Type *type)

{
  char cVar1;
  ulong uVar2;
  size_t sVar3;
  bool bVar4;
  size_t marker;
  size_t local_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (this->_enableWord == true) {
    local_58 = this->_cursor;
    cVar1 = (this->_text)._M_dataplus._M_p[local_58];
    while (((cVar1 != '\0' && (bVar4 = unicodeWhitespace((int)cVar1), !bVar4)) &&
           ((this->_enableOperator != true ||
            (bVar4 = isSingleCharOperator((int)(this->_text)._M_dataplus._M_p[local_58]), !bVar4))))
          ) {
      utf8_next_char(&this->_text,&local_58);
      cVar1 = (this->_text)._M_dataplus._M_p[local_58];
    }
    sVar3 = local_58;
    uVar2 = this->_cursor;
    if (uVar2 < local_58) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)this);
      std::__cxx11::string::operator=((string *)token,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      *type = word;
      this->_cursor = local_58;
      if (uVar2 < sVar3) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Lexer::isWord (std::string& token, Lexer::Type& type)
{
  if (_enableWord)
  {
    std::size_t marker = _cursor;

    while (_text[marker] &&
           ! unicodeWhitespace (_text[marker]) &&
           (! _enableOperator || ! isSingleCharOperator (_text[marker])))
      utf8_next_char (_text, marker);

    if (marker > _cursor)
    {
      token = _text.substr (_cursor, marker - _cursor);
      type = Lexer::Type::word;
      _cursor = marker;
      return true;
    }
  }

  return false;
}